

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_utils.c
# Opt level: O0

char * vrna_cut_point_insert(char *string,int cp)

{
  size_t sVar1;
  char *pcStack_20;
  int len;
  char *ctmp;
  int cp_local;
  char *string_local;
  
  if (cp < 1) {
    pcStack_20 = strdup(string);
  }
  else {
    sVar1 = strlen(string);
    pcStack_20 = (char *)vrna_alloc((int)sVar1 + 2);
    strncpy(pcStack_20,string,(long)(cp + -1));
    pcStack_20[cp + -1] = '&';
    strcat(pcStack_20,string + (long)cp + -1);
  }
  return pcStack_20;
}

Assistant:

PUBLIC char *
vrna_cut_point_insert(const char  *string,
                      int         cp)
{
  char  *ctmp;
  int   len;

  if (cp > 0) {
    len   = strlen(string);
    ctmp  = (char *)vrna_alloc((len + 2) * sizeof(char));
    /* first sequence */
    (void)strncpy(ctmp, string, cp - 1);
    /* spacer */
    ctmp[cp - 1] = '&';
    /* second sequence */
    (void)strcat(ctmp, string + cp - 1);
  } else {
    ctmp = strdup(string);
  }

  return ctmp;
}